

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaInvPnd.cpp
# Opt level: O0

void NaInvPend::CalcLinMatrices
               (NaReal M,NaReal m,NaReal b,NaReal l,NaReal I,NaReal (*A) [4],NaReal *B)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  int i;
  NaReal p;
  NaReal g;
  int local_4c;
  
  dVar1 = in_XMM4_Qa * (in_XMM1_Qa + in_XMM0_Qa) + in_XMM0_Qa * in_XMM1_Qa * in_XMM3_Qa * in_XMM3_Qa
  ;
  *in_RDI = 0;
  in_RDI[1] = 0x3ff0000000000000;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = (-(in_XMM1_Qa * in_XMM3_Qa * in_XMM3_Qa + in_XMM4_Qa) * in_XMM2_Qa) / dVar1;
  in_RDI[6] = (in_XMM1_Qa * in_XMM1_Qa * 9.8 * in_XMM3_Qa * in_XMM3_Qa) / dVar1;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0x3ff0000000000000;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = -(in_XMM1_Qa * in_XMM3_Qa * in_XMM2_Qa) / dVar1;
  in_RDI[0xe] = (in_XMM1_Qa * 9.8 * in_XMM3_Qa * (in_XMM0_Qa + in_XMM1_Qa)) / dVar1;
  in_RDI[0xf] = 0;
  NaPrintLog("A:");
  for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
    NaPrintLog((char *)in_RDI[(long)local_4c * 4],in_RDI[(long)local_4c * 4 + 1],
               in_RDI[(long)local_4c * 4 + 2],in_RDI[(long)local_4c * 4 + 3],
               "\t%7.4f\t%7.4f\t%7.4f\t%7.4f\n");
  }
  *in_RSI = 0;
  in_RSI[1] = (in_XMM1_Qa * in_XMM3_Qa * in_XMM3_Qa + in_XMM4_Qa) / dVar1;
  in_RSI[2] = 0;
  in_RSI[3] = (in_XMM1_Qa * in_XMM3_Qa) / dVar1;
  NaPrintLog((char *)*in_RSI,in_RSI[1],in_RSI[2],in_RSI[3],"B:\t%7.4f\t%7.4f\t%7.4f\t%7.4f\n");
  return;
}

Assistant:

void
NaInvPend::CalcLinMatrices (NaReal M, NaReal m, NaReal b,
			    NaReal l, NaReal I,
			    NaReal A[4][4], NaReal B[4])
{
  NaReal	g = 9.8;
  NaReal	p = I*(m+M)+M*m*l*l;
  A[0][0] = 0;
  A[0][1] = 1;
  A[0][2] = 0;
  A[0][3] = 0;

  A[1][0] = 0;
  A[1][1] = -(I+m*l*l)*b/p;
  A[1][2] = (m*m*g*l*l)/p;
  A[1][3] = 0;

  A[2][0] = 0;
  A[2][1] = 0;
  A[2][2] = 0;
  A[2][3] = 1;

  A[3][0] = 0;
  A[3][1] = -(m*l*b)/p;
  A[3][2] = m*g*l*(M+m)/p;
  A[3][3] = 0;

  NaPrintLog("A:");
  for(int i = 0; i < 4; ++i)
    NaPrintLog("\t%7.4f\t%7.4f\t%7.4f\t%7.4f\n",
	       A[i][0], A[i][1], A[i][2], A[i][3]);

  B[0] = 0;
  B[1] = (I+m*l*l)/p;
  B[2] = 0;
  B[3] = m*l/p;

  NaPrintLog("B:\t%7.4f\t%7.4f\t%7.4f\t%7.4f\n",
	     B[0], B[1], B[2], B[3]);
}